

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::reset
          (basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          binary_stream_sink *sink)

{
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_RSI;
  binary_stream_sink *in_RDI;
  
  binary_stream_sink::operator=((binary_stream_sink *)in_RSI,in_RDI);
  reset(in_RSI);
  return;
}

Assistant:

void reset(Sink&& sink)
    {
        sink_ = std::move(sink);
        reset();
    }